

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O3

void pzshape::TPZShapePrism::SideShapeOrder
               (int side,TPZVec<long> *id,int order,TPZGenMatrix<int> *shapeorders)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int maxAB;
  uint uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong i;
  bool bVar11;
  int a;
  TPZGenMatrix<int> locshapeorders;
  TPZManVector<long,_4> locid;
  int b;
  TPZStack<int,_10> lowersides;
  TPZGenMatrix<int> local_d8;
  TPZManVector<long,_4> local_c0;
  ulong local_80;
  TPZManVector<int,_10> local_78;
  
  if (side < 6) {
    if (shapeorders->fRows != 1) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapeprism.cpp"
                 ,0x1ec);
    }
    piVar3 = TPZGenMatrix<int>::operator()(shapeorders,0,0);
    *piVar3 = 1;
    piVar3 = TPZGenMatrix<int>::operator()(shapeorders,0,1);
    *piVar3 = 0;
    piVar3 = TPZGenMatrix<int>::operator()(shapeorders,0,2);
    *piVar3 = 0;
  }
  else if ((uint)side < 0xf) {
    if (shapeorders->fRows != (long)(int)(order - 1U)) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapeprism.cpp"
                 ,0x1f7);
    }
    if (1 < order) {
      uVar10 = 0;
      do {
        piVar3 = TPZGenMatrix<int>::operator()(shapeorders,uVar10,0);
        *piVar3 = (int)uVar10 + 2;
        uVar10 = uVar10 + 1;
      } while (order - 1U != uVar10);
    }
  }
  else {
    if ((side == 0x13) || (side == 0xf)) {
      iVar5 = (order + -1) * (order + -2);
      uVar7 = iVar5 / 2;
      if (shapeorders->fRows != (long)(int)uVar7) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapeprism.cpp"
                   ,0x203);
      }
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
      pztopology::TPZPrism::LowerDimensionSides(side,(TPZStack<int,_10> *)&local_78);
      TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_78,side);
      iVar1 = pztopology::TPZPrism::NSideNodes(side);
      TPZManVector<long,_4>::TPZManVector(&local_c0,(long)iVar1);
      if (0 < local_c0.super_TPZVec<long>.fNElements) {
        lVar8 = 0;
        do {
          iVar1 = pztopology::TPZPrism::ContainedSideLocId(side,(int)lVar8);
          local_c0.super_TPZVec<long>.fStore[lVar8] = id->fStore[iVar1];
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_c0.super_TPZVec<long>.fNElements);
      }
      TPZGenMatrix<int>::TPZGenMatrix(&local_d8,(long)(int)uVar7,3);
      TPZShapeTriang::SideShapeOrder(6,&local_c0.super_TPZVec<long>,order,&local_d8);
      if (1 < iVar5) {
        uVar10 = 0;
        do {
          piVar3 = TPZGenMatrix<int>::operator()(&local_d8,uVar10,0);
          iVar5 = *piVar3;
          piVar3 = TPZGenMatrix<int>::operator()(shapeorders,uVar10,0);
          *piVar3 = iVar5;
          piVar3 = TPZGenMatrix<int>::operator()(&local_d8,uVar10,1);
          iVar5 = *piVar3;
          piVar3 = TPZGenMatrix<int>::operator()(shapeorders,uVar10,1);
          *piVar3 = iVar5;
          piVar3 = TPZGenMatrix<int>::operator()(&local_d8,uVar10,2);
          iVar5 = *piVar3;
          piVar3 = TPZGenMatrix<int>::operator()(shapeorders,uVar10,2);
          *piVar3 = iVar5;
          uVar10 = uVar10 + 1;
        } while (uVar7 != uVar10);
      }
    }
    else {
      if (0x12 < (uint)side) {
        uVar7 = order - 2;
        if (shapeorders->fRows != (long)((int)((order + -1) * uVar7 * (order + -1)) / 2)) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapeprism.cpp"
                     ,0x24d);
        }
        if (order < 3) {
          return;
        }
        uVar2 = 0;
        iVar5 = 0;
        do {
          local_80 = 0;
          do {
            iVar1 = (int)local_80;
            iVar6 = iVar1 + uVar2 + 3;
            iVar9 = 2;
            do {
              if ((int)(iVar1 + uVar2) < (int)uVar7) {
                lVar8 = (long)iVar5;
                piVar3 = TPZGenMatrix<int>::operator()(shapeorders,lVar8,0);
                *piVar3 = iVar6;
                piVar3 = TPZGenMatrix<int>::operator()(shapeorders,lVar8,1);
                *piVar3 = iVar6;
                piVar3 = TPZGenMatrix<int>::operator()(shapeorders,lVar8,2);
                *piVar3 = iVar9;
                iVar5 = iVar5 + 1;
              }
              bVar11 = iVar9 != order;
              iVar9 = iVar9 + 1;
            } while (bVar11);
            uVar4 = (int)local_80 + 1;
            local_80 = (ulong)uVar4;
          } while (uVar4 != uVar7);
          uVar2 = uVar2 + 1;
        } while (uVar2 != uVar7);
        return;
      }
      iVar5 = order + -1;
      uVar7 = iVar5 * iVar5;
      if (shapeorders->fRows != (ulong)uVar7) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapeprism.cpp"
                   ,0x228);
      }
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
      pztopology::TPZPrism::LowerDimensionSides(side,(TPZStack<int,_10> *)&local_78);
      TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_78,side);
      iVar1 = pztopology::TPZPrism::NSideNodes(side);
      TPZManVector<long,_4>::TPZManVector(&local_c0,(long)iVar1);
      if (0 < local_c0.super_TPZVec<long>.fNElements) {
        lVar8 = 0;
        do {
          iVar1 = pztopology::TPZPrism::ContainedSideLocId(side,(int)lVar8);
          local_c0.super_TPZVec<long>.fStore[lVar8] = id->fStore[iVar1];
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_c0.super_TPZVec<long>.fNElements);
      }
      TPZGenMatrix<int>::TPZGenMatrix(&local_d8,(ulong)uVar7,3);
      TPZShapeQuad::SideShapeOrder(8,&local_c0.super_TPZVec<long>,order,&local_d8);
      if (iVar5 != 0) {
        uVar10 = 1;
        if (1 < uVar7) {
          uVar10 = (ulong)uVar7;
        }
        i = 0;
        do {
          piVar3 = TPZGenMatrix<int>::operator()(&local_d8,i,0);
          iVar5 = *piVar3;
          piVar3 = TPZGenMatrix<int>::operator()(shapeorders,i,0);
          *piVar3 = iVar5;
          piVar3 = TPZGenMatrix<int>::operator()(&local_d8,i,1);
          iVar5 = *piVar3;
          piVar3 = TPZGenMatrix<int>::operator()(shapeorders,i,1);
          *piVar3 = iVar5;
          piVar3 = TPZGenMatrix<int>::operator()(&local_d8,i,2);
          iVar5 = *piVar3;
          piVar3 = TPZGenMatrix<int>::operator()(shapeorders,i,2);
          *piVar3 = iVar5;
          i = i + 1;
        } while (uVar10 != i);
      }
    }
    TPZGenMatrix<int>::~TPZGenMatrix(&local_d8);
    if (local_c0.super_TPZVec<long>.fStore != local_c0.fExtAlloc) {
      local_c0.super_TPZVec<long>.fNAlloc = 0;
      local_c0.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
      if (local_c0.super_TPZVec<long>.fStore != (long *)0x0) {
        operator_delete__(local_c0.super_TPZVec<long>.fStore);
      }
    }
    TPZManVector<int,_10>::~TPZManVector(&local_78);
  }
  return;
}

Assistant:

void TPZShapePrism::SideShapeOrder(const int side,  const TPZVec<int64_t> &id, const int order, TPZGenMatrix<int> &shapeorders)
    {
        //DebugStop();
        if (side<=5)
        {
            if (shapeorders.Rows() != 1)
            {
                DebugStop();
            }
            shapeorders(0,0) = 1;
            shapeorders(0,1) = 0;
            shapeorders(0,2) = 0;
        }
        else if (side>5 && side<15)
        {
            int nshape = order-1;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            for (int ioy = 0; ioy < order-1; ioy++)
            {
                shapeorders(ioy,0) = ioy+2;
            }
        }
        else if (side == 15||side == 19)
        {
            int nshape = (order-2)*(order-1)/2;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            //TPZVec<int> locsideorder(lowersides.size(),order);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];// SideNodeLocId( side, node);
            }// sera que esta pegando os ids corretos mesmo?
            
            TPZGenMatrix<int> locshapeorders(nshape,3);
            
            
            TPZShapeTriang::SideShapeOrder(6,locid, order, locshapeorders);
            
            // temos que arrumar a saida de locshapeorders para adequar a orientacao dos vetores que geram
            // a face do lado side
            
            // aqui o locshapeorders esta armazenado so para x e y
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }


        }
        else if (side >= 16 && side <=18)
        {
            if (shapeorders.Rows() != (order-1)*(order-1))
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            //TPZVec<int> locsideorder(lowersides.size(),order);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];// SideNodeLocId( side, node);
            }// sera que esta pegando os ids corretos mesmo?
            
            int nshape = (order-1)*(order-1);
            TPZGenMatrix<int> locshapeorders(nshape,3);
            
            
            TPZShapeQuad::SideShapeOrder(8,locid, order, locshapeorders);
            
            // temos que arrumar a saida de locshapeorders para adequar a orientacao dos vetores que geram
            // a face do lado side
            
            // aqui o locshapeorders esta armazenado so para x e y
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }

        }
        else
        {   // interno
            int nshape = (order-2)*(order-1)*(order-1)/2;
            if (shapeorders.Rows() != nshape) {
                DebugStop();
            }
            int count = 0;
            int ord1 = order - 2;
            int ord2 = order - 1;
            for (int i=0; i<ord1; i++) {
                for (int j=0; j<ord1; j++) {
                    for (int k=0; k<ord2; k++) {
                        int a = i;
                        int b = j;
                        int c = k;
                        int maxAB = a+b;//a>b? a : b;
                        if (   ( (a+b)<ord1 )  && (c < ord2)   ) // Duvida
                        {
                            shapeorders(count,0) = 3 + maxAB;
                            shapeorders(count,1) = 3 + maxAB;
                            shapeorders(count,2) = 2 + c;
                            count++;
                        }
                        
                    }
                    
                }
            }

//            int orderplus1 = order + 2;
//            int orderplus2 = order + 1;
//            for (int i=3; i<orderplus1; i++) {
//                for (int j=3; j<orderplus1; j++) {
//                    for (int k=3; k<orderplus2; k++) {
//                        int a = i;
//                        int b = j;
//                        int c = k;
//                        if (   ( (a+b)<orderplus1 )  && (c < orderplus2)   ) // Duvida
//                        {
//                            shapeorders(count,0) = a;
//                            shapeorders(count,1) = b;
//                            shapeorders(count,2) = c;
//                            count++;
//                        }
//                        
//                    }
//                    
//                }
//            }

        }

    }